

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

void __thiscall LTACMasterdataChannel::AddIgnore(LTACMasterdataChannel *this)

{
  int iVar1;
  long in_RDI;
  system_error *e;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  set<LTFlightData::FDKeyTy,_std::less<LTFlightData::FDKeyTy>,_std::allocator<LTFlightData::FDKeyTy>_>
  *in_stack_ffffffffffffffa0;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  iVar1 = *(int *)(in_RDI + 0x2d0);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      std::
      set<LTFlightData::FDKeyTy,_std::less<LTFlightData::FDKeyTy>,_std::allocator<LTFlightData::FDKeyTy>_>
      ::insert(in_stack_ffffffffffffffa0,
               (value_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    }
    else if (iVar1 == 2) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffffa0,
               (value_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c515b);
  return;
}

Assistant:

void LTACMasterdataChannel::AddIgnore ()
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        // Insert the key to the ignore list if no master data channel can process it
        switch (currRequ.type) {
            case DATREQU_AC_MASTER:
                setIgnoreAc.insert(currRequ.acKey);
                break;
            case DATREQU_ROUTE:
                setIgnoreCallSign.insert(currRequ.callSign);
                break;
            case DATREQU_NONE:
                break;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
}